

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O3

void show_cores(void)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  core *local_50;
  
  local_50 = first_state;
  if (first_state != (core *)0x0) {
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        putchar(10);
      }
      printf("state %d, number = %d, accessing symbol = %s\n",(ulong)uVar6,
             (ulong)(uint)local_50->number);
      iVar2 = local_50->nitems;
      if (0 < (long)iVar2) {
        lVar4 = 0;
        do {
          uVar3 = local_50->items[lVar4];
          printf("%4d  ",(ulong)uVar3);
          lVar9 = (long)(int)uVar3;
          lVar5 = lVar9 * 4;
          do {
            lVar7 = lVar5;
            lVar5 = lVar7 + 4;
          } while (-1 < *(int *)((long)ritem + lVar7));
          printf("%s :",symbol_name[rlhs[(uint)-*(int *)((long)ritem + lVar7)]]);
          lVar8 = (long)rrhs[-(long)*(int *)((long)ritem + lVar7)];
          lVar5 = lVar8;
          if (rrhs[-(long)*(int *)((long)ritem + lVar7)] < (int)uVar3) {
            do {
              piVar1 = ritem + lVar8;
              lVar8 = lVar8 + 1;
              printf(" %s",symbol_name[*piVar1]);
              lVar5 = lVar9;
            } while (lVar9 != lVar8);
          }
          printf(" .");
          uVar3 = ritem[lVar5];
          if (-1 < (int)uVar3) {
            lVar5 = lVar5 * 4;
            do {
              lVar5 = lVar5 + 4;
              printf(" %s",symbol_name[uVar3]);
              uVar3 = *(uint *)((long)ritem + lVar5);
            } while (-1 < (int)uVar3);
          }
          putchar(10);
          fflush(_stdout);
          lVar4 = lVar4 + 1;
        } while (lVar4 != iVar2);
      }
      uVar6 = uVar6 + 1;
      local_50 = local_50->next;
    } while (local_50 != (core *)0x0);
  }
  return;
}

Assistant:

void show_cores()
{
    core *p;
    int i, j, k, n;
    int itemno;

    k = 0;
    for (p = first_state; p; ++k, p = p->next)
    {
	if (k) printf("\n");
	printf("state %d, number = %d, accessing symbol = %s\n",
		k, p->number, symbol_name[p->accessing_symbol]);
	n = p->nitems;
	for (i = 0; i < n; ++i)
	{
	    itemno = p->items[i];
	    printf("%4d  ", itemno);
	    j = itemno;
	    while (ritem[j] >= 0) ++j;
	    printf("%s :", symbol_name[rlhs[-ritem[j]]]);
	    j = rrhs[-ritem[j]];
	    while (j < itemno)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf(" .");
	    while (ritem[j] >= 0)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf("\n");
	    fflush(stdout);
	}
    }
}